

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O0

bool __thiscall
JsUtil::
BaseDictionary<unsigned_char,_IR::Opnd_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::TryGetValue<unsigned_char>
          (BaseDictionary<unsigned_char,_IR::Opnd_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           *this,uchar *key,Opnd **value)

{
  int iVar1;
  Opnd **ppOVar2;
  int i;
  Opnd **value_local;
  uchar *key_local;
  BaseDictionary<unsigned_char,_IR::Opnd_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_local;
  
  iVar1 = FindEntryWithKey<unsigned_char>(this,key);
  if (-1 < iVar1) {
    ppOVar2 = anon_unknown_4::
              ValueEntry<IR::Opnd_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_char,_IR::Opnd_*>_>
              ::Value((ValueEntry<IR::Opnd_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_char,_IR::Opnd_*>_>
                       *)(this->entries + iVar1));
    *value = *ppOVar2;
  }
  return -1 < iVar1;
}

Assistant:

bool TryGetValue(const TLookup& key, TValue* value) const
        {
            int i = FindEntryWithKey(key);
            if (i >= 0)
            {
                *value = entries[i].Value();
                return true;
            }
            return false;
        }